

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-select.c
# Opt level: O1

ssh_cipher * aes_select(ssh_cipheralg *alg)

{
  char cVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 *puVar4;
  undefined1 uVar5;
  ssh_cipher *unaff_RBX;
  ssh_cipheralg *alg_1;
  undefined8 *puVar6;
  
  puVar6 = (undefined8 *)alg->extra;
  puVar2 = (undefined8 *)*puVar6;
  while (puVar2 != (undefined8 *)0x0) {
    puVar6 = puVar6 + 1;
    puVar3 = (undefined8 *)puVar2[0xd];
    if (*(char *)puVar3[1] == '\0') {
      uVar5 = (*(code *)*puVar3)();
      puVar4 = (undefined1 *)puVar3[1];
      puVar4[1] = uVar5;
      *puVar4 = 1;
    }
    cVar1 = *(char *)(puVar3[1] + 1);
    if (cVar1 == '\x01') {
      unaff_RBX = (ssh_cipher *)(*(code *)*puVar2)(puVar2);
    }
    if (cVar1 != '\0') break;
    puVar2 = (undefined8 *)*puVar6;
  }
  if (puVar2 != (undefined8 *)0x0) {
    return unaff_RBX;
  }
  __assert_fail("false && \"aes_select ran off the end of its list\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-select.c"
                ,0x1b,"ssh_cipher *aes_select(const ssh_cipheralg *)");
}

Assistant:

static ssh_cipher *aes_select(const ssh_cipheralg *alg)
{
    const ssh_cipheralg *const *real_algs = (const ssh_cipheralg **)alg->extra;

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_cipheralg *alg = real_algs[i];
        const struct aes_extra *alg_extra =
            (const struct aes_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_cipher_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only AES, which is
     * always available. */
    unreachable("aes_select ran off the end of its list");
}